

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O1

void run_negation_range_inplace_test1(void)

{
  _Bool unaff_retaddr;
  
  run_negation_range_tests(10,7,0,0,1,1,false,unaff_retaddr);
  return;
}

Assistant:

DEFINE_TEST(run_negation_range_inplace_test1) {
    // runs of length 7, 8, 9 begin every 10
    // starting at 0.
    // (should not have been run encoded, but...)
    // last run starts at 65530 hence we end in a
    // run
    // negation over whole range.  Result should be
    // bitset

    run_negation_range_tests(10, 7, 0, 0x0000, 0x10000, BITSET_CONTAINER_TYPE,
                             true,
                             false);  // request but don't get inplace
}